

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O0

void __thiscall SocketReceiveMultiplexer::Implementation::Implementation(Implementation *this)

{
  int iVar1;
  runtime_error *this_00;
  Implementation *this_local;
  
  std::
  vector<std::pair<PacketListener_*,_UdpSocket_*>,_std::allocator<std::pair<PacketListener_*,_UdpSocket_*>_>_>
  ::vector(&this->socketListeners_);
  std::vector<AttachedTimerListener,_std::allocator<AttachedTimerListener>_>::vector
            (&this->timerListeners_);
  iVar1 = pipe(this->breakPipe_);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"creation of asynchronous break pipes failed\n");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Implementation()
	{
		if( pipe(breakPipe_) != 0 )
			throw std::runtime_error( "creation of asynchronous break pipes failed\n" );
	}